

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O3

int Saig_ManBmcCountRefed(Aig_Man_t *p,Vec_Ptr_t *vSuper)

{
  int iVar1;
  long lVar2;
  
  if ((long)vSuper->nSize < 1) {
    iVar1 = 0;
  }
  else {
    lVar2 = 0;
    iVar1 = 0;
    do {
      if (((ulong)vSuper->pArray[lVar2] & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                      ,0x21e,"int Saig_ManBmcCountRefed(Aig_Man_t *, Vec_Ptr_t *)");
      }
      iVar1 = (iVar1 + 1) -
              (uint)((*(uint *)((long)vSuper->pArray[lVar2] + 0x18) & 0xffffff80) == 0);
      lVar2 = lVar2 + 1;
    } while (vSuper->nSize != lVar2);
  }
  return iVar1;
}

Assistant:

int Saig_ManBmcCountRefed( Aig_Man_t * p, Vec_Ptr_t * vSuper )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pObj, i )
    {
        assert( !Aig_IsComplement(pObj) );
        Counter += (Aig_ObjRefs(pObj) > 1);
    }
    return Counter;
}